

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::ReorderingBuffer::ReorderingBuffer
          (ReorderingBuffer *this,Normalizer2Impl *ni,UnicodeString *dest,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UErrorCode *errorCode_local;
  UnicodeString *dest_local;
  Normalizer2Impl *ni_local;
  ReorderingBuffer *this_local;
  
  this->impl = ni;
  this->str = dest;
  pcVar3 = UnicodeString::getBuffer(this->str,8);
  this->start = pcVar3;
  this->reorderStart = this->start;
  this->limit = this->start;
  iVar2 = UnicodeString::getCapacity(this->str);
  this->remainingCapacity = iVar2;
  this->lastCC = '\0';
  if (this->start == (UChar *)0x0) {
    UVar1 = ::U_SUCCESS(*errorCode);
    if (UVar1 != '\0') {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

ReorderingBuffer::ReorderingBuffer(const Normalizer2Impl &ni, UnicodeString &dest,
                                   UErrorCode &errorCode) :
        impl(ni), str(dest),
        start(str.getBuffer(8)), reorderStart(start), limit(start),
        remainingCapacity(str.getCapacity()), lastCC(0) {
    if (start == nullptr && U_SUCCESS(errorCode)) {
        // getBuffer() already did str.setToBogus()
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}